

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O1

Range __thiscall bssl::DTLSMessageBitmap::NextUnmarkedRange(DTLSMessageBitmap *this,size_t start)

{
  ulong uVar1;
  ulong uVar2;
  uchar *puVar3;
  long lVar4;
  byte bVar5;
  byte b;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  Range RVar11;
  
  uVar7 = this->first_unmarked_byte_ << 3;
  if (uVar7 <= start) {
    uVar7 = start;
  }
  uVar2 = (this->bytes_).size_;
  uVar9 = uVar7 >> 3;
  if (uVar9 < uVar2) {
    puVar3 = (this->bytes_).data_;
    b = ~(-1 << ((byte)uVar7 & 7)) | puVar3[uVar9];
    if (b == 0xff) {
      do {
        uVar7 = uVar9 + 1;
        uVar9 = uVar2;
        bVar5 = b;
        if (uVar2 == uVar7) break;
        uVar9 = uVar7;
        bVar5 = puVar3[uVar7];
      } while (puVar3[uVar7] == 0xff);
      b = bVar5;
      if (uVar2 <= uVar7) goto LAB_0016ccfa;
    }
    RVar11 = FirstUnmarkedRangeInByte(b);
    sVar10 = RVar11.end;
    if (RVar11.start == sVar10) {
      __assert_fail("!range.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,0x93,
                    "DTLSMessageBitmap::Range bssl::DTLSMessageBitmap::NextUnmarkedRange(size_t) const"
                   );
    }
    sVar8 = RVar11.start + uVar9 * 8;
    if (sVar10 == 8) {
      uVar7 = uVar9 + 1;
      if (uVar9 + 1 < uVar2) {
        uVar7 = uVar2;
      }
      do {
        uVar1 = uVar9 + 1;
        uVar6 = uVar7;
        if (uVar2 <= uVar1) break;
        lVar4 = uVar9 + 1;
        uVar6 = uVar1;
        uVar9 = uVar1;
      } while (puVar3[lVar4] == '\0');
      sVar10 = uVar6 * 8;
      if (uVar1 < uVar2) {
        RVar11 = FirstUnmarkedRangeInByte(puVar3[uVar6]);
        if (RVar11.start == 0) {
          sVar10 = sVar10 + RVar11.end;
        }
      }
    }
    else {
      sVar10 = sVar10 + uVar9 * 8;
    }
  }
  else {
LAB_0016ccfa:
    sVar8 = 0;
    sVar10 = 0;
  }
  RVar11.end = sVar10;
  RVar11.start = sVar8;
  return RVar11;
}

Assistant:

DTLSMessageBitmap::Range DTLSMessageBitmap::NextUnmarkedRange(
    size_t start) const {
  // Don't bother looking at bytes that are known to be fully marked.
  start = std::max(start, first_unmarked_byte_ << 3);

  size_t idx = start >> 3;
  if (idx >= bytes_.size()) {
    return Range{0, 0};
  }

  // Look at the bits from |start| up to a byte boundary.
  uint8_t byte = bytes_[idx] | BitRange(0, start & 7);
  if (byte == 0xff) {
    // Nothing unmarked at this byte. Keep searching for an unmarked bit.
    for (idx = idx + 1; idx < bytes_.size(); idx++) {
      if (bytes_[idx] != 0xff) {
        byte = bytes_[idx];
        break;
      }
    }
    if (idx >= bytes_.size()) {
      return Range{0, 0};
    }
  }

  Range range = FirstUnmarkedRangeInByte(byte);
  assert(!range.empty());
  bool should_extend = range.end == 8;
  range.start += idx << 3;
  range.end += idx << 3;
  if (!should_extend) {
    // The range did not end at a byte boundary. We're done.
    return range;
  }

  // Collect all fully unmarked bytes.
  for (idx = idx + 1; idx < bytes_.size(); idx++) {
    if (bytes_[idx] != 0) {
      break;
    }
  }
  range.end = idx << 3;

  // Add any bits from the remaining byte, if any.
  if (idx < bytes_.size()) {
    Range extra = FirstUnmarkedRangeInByte(bytes_[idx]);
    if (extra.start == 0) {
      range.end += extra.end;
    }
  }

  return range;
}